

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll_set.cpp
# Opt level: O0

bool __thiscall miniros::PollSet::delEvents(PollSet *this,int sock,int events)

{
  int epfd;
  bool bVar1;
  uint uVar2;
  iterator this_00;
  pointer ppVar3;
  uint in_EDX;
  __sighandler_t __handler;
  int in_ESI;
  PollSet *in_RDI;
  bool enabled;
  iterator it;
  scoped_lock<std::mutex> lock;
  map<int,_miniros::PollSet::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_miniros::PollSet::SocketInfo>_>_>
  *in_stack_ffffffffffffff48;
  Level level;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  LogLocation *in_stack_ffffffffffffff60;
  Level in_stack_ffffffffffffff74;
  string *name;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined1 local_61 [33];
  _Self local_40 [3];
  _Self local_28 [2];
  uint local_18;
  int local_14;
  byte local_1;
  
  local_18 = in_EDX;
  local_14 = in_ESI;
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (mutex_type *)in_stack_ffffffffffffff48);
  this_00 = std::
            map<int,_miniros::PollSet::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_miniros::PollSet::SocketInfo>_>_>
            ::find(in_stack_ffffffffffffff48,(key_type_conflict1 *)0x484ebd);
  local_28[0]._M_node = this_00._M_node;
  local_40[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_miniros::PollSet::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_miniros::PollSet::SocketInfo>_>_>
       ::end(in_stack_ffffffffffffff48);
  level = (Level)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  bVar1 = std::operator!=(local_28,local_40);
  if (bVar1) {
    uVar2 = local_18 ^ 0xffffffff;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_miniros::PollSet::SocketInfo>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_miniros::PollSet::SocketInfo>_> *)
                        0x484f13);
    (ppVar3->second).events_ = uVar2 & (ppVar3->second).events_;
    epfd = in_RDI->epfd_;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_miniros::PollSet::SocketInfo>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_miniros::PollSet::SocketInfo>_> *)
                        0x4850e0);
    set_events_on_socket(epfd,local_14,(ppVar3->second).events_);
    in_RDI->sockets_changed_ = true;
    signal(in_RDI,local_14,__handler);
    local_1 = 1;
  }
  else {
    if (((console::g_initialized ^ 0xff) & 1) != 0) {
      console::initialize();
    }
    if (((delEvents::loc.initialized_ ^ 0xffU) & 1) != 0) {
      name = (string *)local_61;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 this_00._M_node,(char *)in_RDI,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      console::initializeLogLocation
                ((LogLocation *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),name,
                 in_stack_ffffffffffffff74);
      std::__cxx11::string::~string((string *)(local_61 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_61);
    }
    if (delEvents::loc.level_ != Debug) {
      console::setLogLocationLevel
                ((LogLocation *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),level)
      ;
      console::checkLogLocationEnabled(in_stack_ffffffffffffff60);
    }
    if ((delEvents::loc.logger_enabled_ & 1U) != 0) {
      console::print((FilterBase *)0x0,delEvents::loc.logger_,(Level)(ulong)delEvents::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/poll_set.cpp"
                     ,0xa1,"bool miniros::PollSet::delEvents(int, int)",
                     "PollSet: Tried to delete events [%d] to fd [%d] which does not exist in this pollset"
                     ,local_18,local_14);
    }
    local_1 = 0;
  }
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x48511f);
  return (bool)(local_1 & 1);
}

Assistant:

bool PollSet::delEvents(int sock, int events)
{
  std::scoped_lock<std::mutex> lock(socket_info_mutex_);

  M_SocketInfo::iterator it = socket_info_.find(sock);
  if (it != socket_info_.end())
  {
    it->second.events_ &= ~events;
  }
  else
  {
    MINIROS_DEBUG("PollSet: Tried to delete events [%d] to fd [%d] which does not exist in this pollset", events, sock);
    return false;
  }

  set_events_on_socket(epfd_, sock, it->second.events_);

  sockets_changed_ = true;
  signal();

  return true;
}